

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall
imrt::Station::reduce_apertures
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  _Rb_tree_color unaff_EBP;
  int iVar8;
  _Rb_tree_color unaff_R12D;
  int j;
  long lVar9;
  int i;
  long lVar10;
  int local_40;
  
  if ((this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var5 = (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = 10000;
    iVar4 = 0;
    _Var6 = _S_red;
    while ((_Rb_tree_header *)p_Var5 != &(this->int2nb)._M_t._M_impl.super__Rb_tree_header) {
      _Var1 = p_Var5[1]._M_color;
      iVar2 = *(int *)&p_Var5[1].field_0x4;
      iVar8 = iVar4;
      if (iVar2 <= iVar4) {
        iVar8 = iVar2;
      }
      if (_Var6 == _S_red) {
        iVar8 = iVar2;
      }
      iVar8 = (_Var1 - _Var6) * iVar8;
      _Var7 = _Var6;
      _Var3 = _Var1;
      if (_Var6 == _S_red || iVar2 <= iVar4) {
        _Var7 = _Var1;
        _Var3 = _Var6;
      }
      if (iVar8 < local_40) {
        unaff_EBP = _Var7;
        local_40 = iVar8;
        unaff_R12D = _Var3;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      iVar4 = iVar2;
      _Var6 = _Var1;
    }
    for (lVar10 = 0; iVar4 = Collimator::getXdim(this->collimator), lVar10 < iVar4;
        lVar10 = lVar10 + 1) {
      for (lVar9 = 0; iVar4 = Collimator::getYdim(this->collimator), lVar9 < iVar4;
          lVar9 = lVar9 + 1) {
        if (unaff_EBP == (int)((this->I).p[lVar10][lVar9] + 0.5)) {
          change_intensity(this,(int)lVar10,(int)lVar9,(double)(int)unaff_R12D,diff);
        }
      }
    }
  }
  return;
}

Assistant:

void Station::reduce_apertures(list< pair< int, double > >& diff){
	  if(int2nb.size()==0) return;

      int from,to, min_diff=10000;
      int prev=0; int nprev=0;
      for(auto i:int2nb  ){
          int n= (prev!=0)? min(i.second,nprev) : i.second;
          if((i.first-prev)*n < min_diff){
            min_diff=(i.first-prev)*n;
            if(nprev<i.second && prev!=0) {from=prev; to=i.first;}
            else {to=prev; from=i.first;}
          }
          prev=i.first;
          nprev=i.second;
      }
    //  printIntensity();
      for(int i=0; i<collimator.getXdim(); i++)
        for(int j=0; j<collimator.getYdim(); j++)
          if(int(I(i,j)+0.5)==from)
            change_intensity(i, j, to, &diff);
  }